

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beectl.c
# Opt level: O0

char * which(char *executable,size_t executable_size)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  bool bVar3;
  char *org_path;
  size_t alloc_pathname_size;
  size_t dir_len;
  size_t pathname_size;
  char *path;
  char *pathname;
  char *dir;
  size_t executable_size_local;
  char *executable_local;
  
  org_path = (char *)0x100;
  if (executable_size < 2) {
    executable_local = (char *)0x0;
  }
  else {
    if (executable == (char *)0x0) {
      __assert_fail("executable != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/rosmanov[P]bee-host/src/beectl.c"
                    ,0x5a,"char *which(char *, size_t)");
    }
    if (executable == (char *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = *executable == '/';
    }
    if (bVar3) {
      executable_local = strdup(executable);
    }
    else {
      pcVar2 = getenv("PATH");
      if (pcVar2 == (char *)0x0) {
        perror("Environment variable PATH variable was not found");
        executable_local = (char *)0x0;
      }
      else {
        pcVar2 = strdup(pcVar2);
        if (pcVar2 == (char *)0x0) {
          perror("strdup");
          executable_local = (char *)0x0;
        }
        else {
          path = (char *)malloc(0x100);
          if (path == (char *)0x0) {
            perror("malloc failed");
            free(pcVar2);
            executable_local = (char *)0x0;
          }
          else {
            pathname = strtok(pcVar2,":");
            while (pathname != (char *)0x0) {
              __n = strlen(pathname);
              dir_len = __n + 1 + executable_size;
              if (org_path < dir_len) {
                org_path = (char *)(dir_len + 0x80);
                path = (char *)realloc(path,(size_t)org_path);
                dir_len = (size_t)org_path;
                if (path == (char *)0x0) {
                  perror("realloc");
                  free(pcVar2);
                  return (char *)0x0;
                }
              }
              memset(path,0,dir_len);
              memcpy(path,pathname,__n);
              path[__n] = '/';
              memcpy(path + __n + 1,executable,executable_size);
              iVar1 = access(path,0);
              if (iVar1 == 0) {
                free(pcVar2);
                return path;
              }
              pathname = strtok((char *)0x0,":");
            }
            free(pcVar2);
            if (path != (char *)0x0) {
              free(path);
            }
            executable_local = (char *)0x0;
          }
        }
      }
    }
  }
  return executable_local;
}

Assistant:

static char *
which (char *executable, size_t executable_size)
{
  char *dir = NULL;
  char *pathname = NULL;
  char *path = NULL;
  size_t pathname_size = 0;
  size_t dir_len = 0;
  size_t alloc_pathname_size = 256;
  const char *org_path;

  if (executable_size <= 1)
    return NULL;
  assert (executable != NULL);

  if (is_absolute_path (executable, executable_size))
    return strdup (executable);

  if (unlikely ((org_path = getenv ("PATH")) == NULL))
    {
      perror ("Environment variable PATH variable was not found");
      return NULL;
    }

  path = strdup (org_path);
  if (unlikely (path == NULL))
    {
      perror ("strdup");
      return NULL;
    }

  /* Pre-allocate memory for pathname */
  if (unlikely ((pathname = malloc (alloc_pathname_size)) == NULL))
    {
      perror ("malloc failed");
      free (path);
      return NULL;
    }

  for (dir = strtok (path, PATH_DELIMITER);
       dir != NULL;
       dir = strtok (NULL, PATH_DELIMITER))
    {
      dir_len = strlen (dir);

      pathname_size = dir_len + DIR_SEPARATOR_LEN + executable_size;

      /* Allocate more memory if needed */
      if (alloc_pathname_size < pathname_size)
        {
          pathname_size += REALLOC_PATHNAME_STEP;
          if (unlikely ((pathname = realloc (pathname, pathname_size)) == NULL))
            {
              perror ("realloc");
              free (path);
              return NULL;
            }
          alloc_pathname_size = pathname_size;
        }

      /* Build pathname */
      memset (pathname, 0, pathname_size);
      memcpy (pathname, dir, dir_len);
      static_assert (DIR_SEPARATOR_LEN == sizeof (char),
                    "DIR_SEPARATOR is expected to be a char");
      pathname[dir_len] = DIR_SEPARATOR;
      memcpy (pathname + dir_len + DIR_SEPARATOR_LEN,
              executable, executable_size);

      if (!access (pathname, F_OK))
        {
          free (path);
          return pathname;
        }
    }

  free (path);
  if (pathname != NULL)
    free (pathname);

  return NULL;
}